

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall
BpTree<int>::Redistribute(BpTree<int> *this,IndexNode<int> *C,IndexNode<int> *D,int k2,int i,int j)

{
  vector<int,_std::allocator<int>_> *__x;
  vector<char,_std::allocator<char>_> *__x_00;
  vector<Addr,_std::allocator<Addr>_> *__x_01;
  vector<char,_std::allocator<char>_> *__x_02;
  vector<Addr,_std::allocator<Addr>_> *__x_03;
  Addr *pAVar1;
  pointer piVar2;
  pointer pcVar3;
  pointer pAVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  vector<int,_std::allocator<int>_> *__x_04;
  ulong uVar13;
  size_t sVar14;
  IndexNode<int> E;
  IndexNode<int> P;
  IndexNode<int> local_450;
  IndexNode<int> local_3f0;
  IndexNode<int> local_390;
  IndexNode<int> local_330;
  IndexNode<int> local_2d0;
  char local_270;
  vector<int,_std::allocator<int>_> local_268;
  vector<char,_std::allocator<char>_> local_250;
  vector<Addr,_std::allocator<Addr>_> local_238;
  Addr local_220;
  Addr AStack_218;
  char local_210;
  vector<int,_std::allocator<int>_> local_208;
  vector<char,_std::allocator<char>_> local_1f0;
  vector<Addr,_std::allocator<Addr>_> local_1d8;
  Addr local_1c0;
  Addr AStack_1b8;
  IndexNode<int> local_1b0;
  IndexNode<int> local_150;
  char local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  vector<char,_std::allocator<char>_> local_d0;
  vector<Addr,_std::allocator<Addr>_> local_b8;
  Addr local_a0;
  Addr AStack_98;
  char local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<char,_std::allocator<char>_> local_70;
  vector<Addr,_std::allocator<Addr>_> local_58;
  Addr local_40;
  Addr AStack_38;
  
  local_210 = C->NodeState;
  __x_04 = &C->k;
  std::vector<int,_std::allocator<int>_>::vector(&local_208,__x_04);
  __x_02 = &C->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_1f0,__x_02);
  __x_03 = &C->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1d8,__x_03);
  local_1c0 = C->parent;
  AStack_1b8 = C->self;
  Buffer::Lock(&blocks,AStack_1b8.BlockNum);
  if (local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_270 = D->NodeState;
  __x = &D->k;
  std::vector<int,_std::allocator<int>_>::vector(&local_268,__x);
  __x_00 = &D->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_250,__x_00);
  __x_01 = &D->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_238,__x_01);
  local_220 = D->parent;
  AStack_218 = D->self;
  Buffer::Lock(&blocks,AStack_218.BlockNum);
  if (local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  IndexNode<int>::IndexNode(&local_3f0,this->N);
  IndexNode<int>::IndexNode(&local_450,this->N);
  pAVar1 = &C->parent;
  FindNode(this,*pAVar1,&local_3f0);
  if (j < i) {
    local_90 = C->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_88,__x_04);
    std::vector<char,_std::allocator<char>_>::vector(&local_70,__x_02);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_58,__x_03);
    cVar5 = local_90;
    local_40 = *pAVar1;
    AStack_38 = C->self;
    if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar6 = this->N;
    if (cVar5 == '1') {
      lVar10 = -1;
      if (1 < (int)uVar6) {
        uVar9 = uVar6 - 1;
        uVar13 = 0;
        do {
          if ((__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar13] != '1') {
            uVar9 = (uint)uVar13;
            break;
          }
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
        lVar10 = (long)(int)(uVar9 - 1);
        if (uVar6 != 2) {
          uVar13 = (ulong)(uVar6 - 2) + 1;
          do {
            piVar2 = (__x_04->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar2[uVar13 - 1] = piVar2[uVar13 - 2];
            pcVar3 = (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar3[uVar13 - 1] = pcVar3[uVar13 - 2];
            pAVar4 = (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pAVar4[uVar13 - 1] = pAVar4[uVar13 - 2];
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
      }
      *(__x_04->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar10];
      *(__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start = '1';
      *(__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
       _M_start = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar10];
      local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[j] = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar10];
      (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = '0';
      pAVar4 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar10;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    else {
      if ((int)uVar6 < 1) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        do {
          if ((__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar13].FileOff == -1) goto LAB_00138710;
          uVar13 = uVar13 + 1;
        } while (uVar6 != uVar13);
        uVar13 = (ulong)uVar6;
      }
LAB_00138710:
      iVar8 = (int)uVar13;
      iVar7 = iVar8 + -1;
      pAVar4 = (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pAVar4[(long)(int)uVar6 + -1] = pAVar4[(long)(int)uVar6 + -2];
      if (2 < this->N) {
        uVar13 = (ulong)(this->N - 2) + 1;
        do {
          piVar2 = (__x_04->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar2[uVar13 - 1] = piVar2[uVar13 - 2];
          pcVar3 = (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar3[uVar13 - 1] = pcVar3[uVar13 - 2];
          pAVar4 = (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pAVar4[uVar13 - 1] = pAVar4[uVar13 - 2];
          uVar13 = uVar13 - 1;
        } while (1 < uVar13);
      }
      *(__x_04->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start = k2;
      *(__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start = '1';
      *(__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
       _M_start = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar7];
      FindNode(this,(__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar7],&local_450);
      local_450.parent = C->self;
      local_2d0.NodeState = local_450.NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_2d0.k,&local_450.k);
      local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                (&local_2d0.v.super__Vector_base<char,_std::allocator<char>_>,
                 (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      pcVar3 = local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar14 = (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (sVar14 != 0) {
        memmove(local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,sVar14);
      }
      local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar3 + sVar14;
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_2d0.p,&local_450.p);
      local_2d0.parent = local_450.parent;
      local_2d0.self = local_450.self;
      UpdateBlock(this,&local_2d0);
      if (local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[j] = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar8 + -2];
      pAVar4 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar7;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
      (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start[(long)iVar8 + -2] = '0';
    }
  }
  else {
    local_f0 = C->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_e8,__x_04);
    std::vector<char,_std::allocator<char>_>::vector(&local_d0,__x_02);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_b8,__x_03);
    cVar5 = local_f0;
    local_a0 = *pAVar1;
    AStack_98 = C->self;
    if (local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar6 = this->N;
    if (cVar5 == '1') {
      pcVar3 = (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)uVar6 < 2) {
        uVar13 = 0;
      }
      else {
        uVar6 = uVar6 - 1;
        uVar13 = 0;
        do {
          if (pcVar3[uVar13] != '1') {
            uVar6 = (uint)uVar13;
            break;
          }
          uVar13 = uVar13 + 1;
        } while (uVar6 != uVar13);
        uVar13 = (ulong)uVar6;
      }
      (__x_04->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar13] =
           *(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
      pcVar3[uVar13] = '1';
      (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar13] =
           *(__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
            super__Vector_impl_data._M_start;
      local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[i] = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[1];
      iVar8 = this->N;
      if (2 < iVar8) {
        lVar10 = 1;
        do {
          piVar2 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar2[lVar10 + -1] = piVar2[lVar10];
          pcVar3 = (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar3[lVar10 + -1] = pcVar3[lVar10];
          pAVar4 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pAVar4[lVar10 + -1] = pAVar4[lVar10];
          lVar10 = lVar10 + 1;
          iVar8 = this->N;
        } while (lVar10 < (long)iVar8 + -1);
      }
      pAVar4 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)iVar8 + -2;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    else {
      if ((int)uVar6 < 1) {
        uVar13 = 0;
      }
      else {
        uVar11 = 0;
        do {
          uVar13 = uVar11;
          if ((__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11].FileOff == -1) break;
          uVar11 = uVar11 + 1;
          uVar13 = (ulong)uVar6;
        } while (uVar6 != uVar11);
      }
      (__x_04->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(long)(int)uVar13 + -1] = k2;
      (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start[(long)(int)uVar13 + -1] = '1';
      (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar13 & 0xffffffff] =
           *(__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
            super__Vector_impl_data._M_start;
      FindNode(this,*(__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                     super__Vector_impl_data._M_start,&local_450);
      local_450.parent = C->self;
      local_330.NodeState = local_450.NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_330.k,&local_450.k);
      local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                (&local_330.v.super__Vector_base<char,_std::allocator<char>_>,
                 (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      pcVar3 = local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar14 = (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (sVar14 != 0) {
        memmove(local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,sVar14);
      }
      local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar3 + sVar14;
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_330.p,&local_450.p);
      local_330.parent = local_450.parent;
      local_330.self = local_450.self;
      UpdateBlock(this,&local_330);
      if (local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[i] = *(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      iVar8 = this->N;
      if ((long)iVar8 < 3) {
        lVar10 = (long)iVar8 + -1;
      }
      else {
        lVar12 = 1;
        do {
          piVar2 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar2[lVar12 + -1] = piVar2[lVar12];
          pcVar3 = (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar3[lVar12 + -1] = pcVar3[lVar12];
          pAVar4 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pAVar4[lVar12 + -1] = pAVar4[lVar12];
          lVar12 = lVar12 + 1;
          iVar8 = this->N;
          lVar10 = (long)iVar8 + -1;
        } while (lVar12 < lVar10);
      }
      pAVar4 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pAVar4[(long)iVar8 + -2] = pAVar4[lVar10];
      pAVar4 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)this->N + -1;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[(long)this->N + -2] = '0';
  }
  local_150.NodeState = C->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_150.k,__x_04);
  std::vector<char,_std::allocator<char>_>::vector(&local_150.v,__x_02);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_150.p,__x_03);
  local_150.parent = *pAVar1;
  local_150.self = C->self;
  UpdateBlock(this,&local_150);
  if (local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1b0.NodeState = D->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_1b0.k,__x);
  std::vector<char,_std::allocator<char>_>::vector(&local_1b0.v,__x_00);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1b0.p,__x_01);
  local_1b0.parent = D->parent;
  local_1b0.self = D->self;
  UpdateBlock(this,&local_1b0);
  if (local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_390.NodeState = local_3f0.NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_390.k,&local_3f0.k);
  local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
            (&local_390.v.super__Vector_base<char,_std::allocator<char>_>,
             (long)local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  pcVar3 = local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar14 = (long)local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (sVar14 != 0) {
    memmove(local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,
            local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,sVar14);
  }
  local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar3 + sVar14;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_390.p,&local_3f0.p);
  local_390.parent = local_3f0.parent;
  local_390.self = local_3f0.self;
  UpdateBlock(this,&local_390);
  if (local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BpTree<K>::Redistribute(IndexNode<K>& C, IndexNode<K>& D, K k2, int i, int j) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> P(N);
	IndexNode<K> E(N);
	this->FindNode(C.parent, P);
	int m, n;
	//�������������
	if (j < i) {
		//D��C������
		if (!this->IsLeaf(C)) {
			for (m = 0; m < N && D.p[m].FileOff != -1; m++);
			m--;		//D.p[m]��D�����һ����Чָ��
			C.p[N - 1] = C.p[N - 2];
			for (n = N - 2; n >= 1; n--) {
				C.k[n] = C.k[n - 1];
				C.v[n] = C.v[n - 1];
				C.p[n] = C.p[n - 1];
			}
			C.k[0] = k2;
			C.v[0] = '1';
			C.p[0] = D.p[m];							//�ֳ�����һ�����C��
			this->FindNode(D.p[m], E);
			E.parent = C.self;		//���±��ƶ����ĸ���
			this->UpdateBlock(E);
			P.k[j] = D.k[m - 1];						//����CD֮��ļ�ֵ
			D.p[m] = { -1,-1 };
			D.v[m - 1] = '0';							//ɾ��D�б��ֳ�ȥ����һ��
		}
		else {
			for (m = 0; m < N - 1 && D.v[m] == '1'; m++);
			m--;		//(D.p[m],D.k[m])��D�����һ����Ч����
			for (n = N - 2; n >= 1; n--) {
				C.k[n] = C.k[n - 1];
				C.v[n] = C.v[n - 1];
				C.p[n] = C.p[n - 1];
			}
			C.k[0] = D.k[m];
			C.v[0] = '1';
			C.p[0] = D.p[m];							//�ֳ�����һ�����C��
			P.k[j] = D.k[m];		//����CD֮��ļ�ֵ
			D.v[m] = '0';
			D.p[m] = { -1, -1 };						//ɾ��D�б��ֳ�ȥ����һ��
		}
	}
	else {
		//D��C������
		if (!this->IsLeaf(C)) {
			for (m = 0; m < N && C.p[m].FileOff != -1; m++);		//C.p[m]��C.k[m-1]�ǿյ�
			C.k[m - 1] = k2;
			C.v[m - 1] = '1';
			C.p[m] = D.p[0];
			this->FindNode(D.p[0], E);
			E.parent = C.self;
			this->UpdateBlock(E);
			P.k[i] = D.k[0];
			for (n = 1; n < N - 1; n++) {
				D.k[n - 1] = D.k[n];
				D.v[n - 1] = D.v[n];
				D.p[n - 1] = D.p[n];
			}
			D.p[N - 2] = D.p[N - 1];
			D.p[N - 1] = { -1, -1 };
			D.v[N - 2] = '0';
		}
		else {
			for (m = 0; m < N - 1 && C.v[m] == '1'; m++);		//C.k[m]��C.p[m]�ǿյ�
			C.k[m] = D.k[0];
			C.v[m] = '1';
			C.p[m] = D.p[0];
			P.k[i] = D.k[1];
			for (n = 1; n < N - 1; n++) {
				D.k[n - 1] = D.k[n];
				D.v[n - 1] = D.v[n];
				D.p[n - 1] = D.p[n];
			}
			D.p[N - 2] = { -1, -1 };
			D.v[N - 2] = '0';
		}
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	this->UpdateBlock(P);
	return;
}